

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bf_crc.hpp
# Opt level: O2

void __thiscall
bf_crc::set_parameters
          (bf_crc *this,uint16_t crc_width,uint32_t polynomial,bool probe_final_xor,
          uint32_t final_xor,bool probe_initial,uint32_t initial,bool probe_reflected_input,
          bool probe_reflected_output,FEED_TYPE feed_type)

{
  set_crc_width(this,crc_width);
  this->polynomial_ = polynomial;
  update_test_vector_count(this);
  set_probe_final_xor(this,probe_final_xor);
  this->final_xor_ = final_xor;
  set_probe_initial(this,probe_initial);
  this->initial_ = initial;
  set_probe_reflected_input(this,probe_reflected_input);
  set_probe_reflected_output(this,probe_reflected_output);
  this->feed_type_ = feed_type;
  return;
}

Assistant:

void set_parameters(	uint16_t crc_width, 
								uint32_t polynomial, 
								bool probe_final_xor, 
								uint32_t final_xor, 
								bool probe_initial, 
								uint32_t initial, 
								bool probe_reflected_input, 
					bool probe_reflected_output,
					my_crc_basic::FEED_TYPE feed_type)
		{
			set_crc_width(crc_width);
			set_polynomial(polynomial);
			set_probe_final_xor(probe_final_xor);
			set_final_xor(final_xor);
			set_probe_initial(probe_initial);
			set_initial(initial);
			set_probe_reflected_input(probe_reflected_input);
			set_probe_reflected_output(probe_reflected_output);
			set_feed_type(feed_type);
		}